

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDEdgePtr __thiscall ON_SubDFace::EdgePtrFromEdge(ON_SubDFace *this,ON_SubDEdge *e)

{
  ON_SubDEdgePtr *pOVar1;
  bool bVar2;
  ulong in_RAX;
  ON_SubDEdgePtr *pOVar3;
  uint uVar4;
  
  if (e != (ON_SubDEdge *)0x0) {
    bVar2 = true;
    if (this->m_edge_count != 0) {
      pOVar1 = this->m_edgex;
      pOVar3 = this->m_edge4;
      uVar4 = 0;
      do {
        in_RAX = CONCAT71((int7)(in_RAX >> 8),pOVar1 != (ON_SubDEdgePtr *)0x0);
        if (uVar4 == 4) {
          pOVar3 = pOVar1;
        }
        if (uVar4 == 4 && pOVar1 == (ON_SubDEdgePtr *)0x0) break;
        in_RAX = pOVar3->m_ptr;
        if ((ON_SubDEdge *)(in_RAX & 0xfffffffffffffff8) == e) {
          bVar2 = false;
          break;
        }
        uVar4 = uVar4 + 1;
        pOVar3 = pOVar3 + 1;
      } while (this->m_edge_count != uVar4);
    }
    if (!bVar2) {
      return (ON_SubDEdgePtr)in_RAX;
    }
  }
  return (ON_SubDEdgePtr)0;
}

Assistant:

const ON_SubDEdgePtr ON_SubDFace::EdgePtrFromEdge(
  const class ON_SubDEdge* e
) const
{
  if (nullptr != e)
  {
    const ON_SubDEdgePtr* eptr = m_edge4;
    const unsigned int face_edge_count = m_edge_count;
    for (unsigned int fei = 0; fei < face_edge_count; fei++, eptr++)
    {
      if (4 == fei)
      {
        eptr = m_edgex;
        if (nullptr == eptr)
          break;
      }
      if (e == ON_SUBD_EDGE_POINTER(eptr->m_ptr))
        return *eptr;
    }
  }

  return ON_SubDEdgePtr::Null;
}